

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O3

TestStatus *
vkt::wsi::anon_unknown_0::querySurfaceFormatsTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  ostringstream *this;
  VkPhysicalDevice_s *pVVar1;
  pointer pVVar2;
  TestStatus *pTVar3;
  undefined1 *puVar4;
  bool bVar5;
  qpTestResult qVar6;
  __normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  _Var7;
  long *plVar8;
  VkSurfaceFormatKHR *pVVar9;
  long lVar10;
  ulong uVar11;
  Vector<unsigned_int,_2> *log;
  undefined1 *puVar12;
  VkSurfaceKHR surface;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> outputData;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> formats;
  ResultCollector results;
  InstanceHelper instHelper;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  Type local_474;
  undefined **local_470;
  undefined8 local_468;
  undefined *local_460 [2];
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_450;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> local_438;
  uint local_420 [2];
  Vector<unsigned_int,_2> *local_418;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_410;
  uint local_408 [2];
  VkAllocationCallbacks *pVStack_400;
  TestStatus *local_3f0;
  Vector<unsigned_int,_2> *local_3e8;
  undefined1 *local_3e0;
  NativeObjects local_3d8;
  ResultCollector local_3b8;
  undefined1 local_368 [16];
  Vector<unsigned_int,_2> local_358;
  VkAllocationCallbacks *pVStack_350;
  ios_base local_2f8 [8];
  ios_base local_2f0 [264];
  undefined1 local_1e8 [32];
  DestroyInstanceFunc p_Stack_1c8;
  VkAllocationCallbacks *local_1c0;
  InstanceDriver local_1b8;
  
  log = (Vector<unsigned_int,_2> *)context->m_testCtx->m_log;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  tcu::ResultCollector::ResultCollector(&local_3b8,(TestLog *)log,(string *)local_1e8);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_368._0_8_ = (Vector<unsigned_int,_2> *)0x0;
  NativeObjects::NativeObjects
            (&local_3d8,(Context *)context->m_testCtx->m_platform,(Extensions *)local_1e8,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_368);
  local_3f0 = __return_storage_ptr__;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_368,&local_1b8.super_InstanceInterface,
             (VkInstance)local_1e8._24_8_,wsiType,
             local_3d8.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_3d8.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_408[0] = local_358.m_data[0];
  local_408[1] = local_358.m_data[1];
  pVStack_400 = pVStack_350;
  local_418 = (Vector<unsigned_int,_2> *)local_368._0_8_;
  aStack_410.m_align = local_368._8_8_;
  ::vk::enumeratePhysicalDevices
            (&local_450,&local_1b8.super_InstanceInterface,(VkInstance)local_1e8._24_8_);
  if (local_450.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_450.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    puVar12 = (undefined1 *)0x0;
    local_3e0 = wsi::(anonymous_namespace)::
                validateSurfaceFormats(tcu::ResultCollector&,vk::wsi::Type,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>const&)
                ::s_androidFormats;
    if (wsiType != TYPE_ANDROID) {
      local_3e0 = puVar12;
    }
    surface.m_internal = (deUint64)local_418;
    local_474 = wsiType;
    local_3e8 = log;
    do {
      bVar5 = isSupportedByAnyQueue
                        (&local_1b8.super_InstanceInterface,
                         local_450.
                         super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)puVar12],surface);
      if (bVar5) {
        ::vk::wsi::getPhysicalDeviceSurfaceFormats
                  (&local_438,&local_1b8.super_InstanceInterface,
                   local_450.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)puVar12],surface);
        this = (ostringstream *)(local_368 + 8);
        local_368._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Device ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
        local_498._0_8_ =
             local_438.
             super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_498._8_8_ =
             local_438.
             super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        tcu::Format::operator<<
                  ((ostream *)this,
                   (Array<__gnu_cxx::__normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>_>
                    *)local_498);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::ios_base::~ios_base(local_2f0);
        puVar4 = local_3e0;
        if (wsiType == TYPE_ANDROID) {
          lVar10 = 0;
          do {
            pVVar2 = local_438.
                     super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            _Var7 = std::
                    __find_if<__gnu_cxx::__normal_iterator<vk::VkSurfaceFormatKHR_const*,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>>,__gnu_cxx::__ops::_Iter_equals_val<vk::VkSurfaceFormatKHR_const>>
                              (local_438.
                               super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_438.
                               super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (VkSurfaceFormatKHR *)(puVar4 + lVar10));
            if (_Var7._M_current == pVVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
              ::vk::operator<<((ostream *)local_368,(VkSurfaceFormatKHR *)(puVar4 + lVar10));
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
              std::ios_base::~ios_base(local_2f8);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_470);
              pVVar9 = (VkSurfaceFormatKHR *)(plVar8 + 2);
              if ((VkSurfaceFormatKHR *)*plVar8 == pVVar9) {
                local_488._M_allocated_capacity = (size_type)*pVVar9;
                local_488._8_8_ = plVar8[3];
                local_498._0_8_ = (VkSurfaceFormatKHR *)(local_498 + 0x10);
              }
              else {
                local_488._M_allocated_capacity = (size_type)*pVVar9;
                local_498._0_8_ = (VkSurfaceFormatKHR *)*plVar8;
              }
              local_498._8_8_ = plVar8[1];
              *plVar8 = (long)pVVar9;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              tcu::ResultCollector::fail(&local_3b8,(string *)local_498);
              if ((VkSurfaceFormatKHR *)local_498._0_8_ != (VkSurfaceFormatKHR *)(local_498 + 0x10))
              {
                operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
              }
              if (local_470 != local_460) {
                operator_delete(local_470,(ulong)(local_460[0] + 1));
              }
            }
            lVar10 = lVar10 + 8;
            surface.m_internal = (deUint64)local_418;
          } while (lVar10 != 0x18);
        }
        local_468 = 0;
        local_470 = &PTR__CheckIncompleteResult_00d33e68;
        if ((long)local_438.
                  super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_438.
                  super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          uVar11 = (long)local_438.
                         super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_438.
                         super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          pVVar1 = local_450.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)puVar12];
          std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::vector
                    ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)
                     local_498,uVar11,(allocator_type *)local_368);
          if ((ulong)local_498._0_8_ < (ulong)local_498._8_8_) {
            pVVar9 = (VkSurfaceFormatKHR *)(local_498._0_8_ + 8);
            if ((VkSurfaceFormatKHR *)(local_498._0_8_ + 8) < (ulong)local_498._8_8_) {
              pVVar9 = (VkSurfaceFormatKHR *)local_498._8_8_;
            }
            memset((void *)local_498._0_8_,0xde,
                   ((long)&pVVar9->format + ~local_498._0_8_ & 0xfffffffffffffff8U) + 8);
          }
          uVar11 = uVar11 / 3;
          local_468 = uVar11 & 0xffffffff;
          (*(code *)local_470[2])(&local_470,&local_1b8,pVVar1,surface.m_internal,local_498._0_8_);
          if (((int)local_468 == (int)uVar11) && (local_468._4_4_ == 5)) {
            for (pVVar9 = (VkSurfaceFormatKHR *)(local_498._0_8_ + (uVar11 & 0xffffffff) * 8);
                pVVar9 < (ulong)local_498._8_8_; pVVar9 = pVVar9 + 1) {
              lVar10 = 0;
              do {
                if (*(char *)((long)&pVVar9->format + lVar10) != -0x22) goto LAB_0073dd8d;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 8);
            }
          }
          else {
LAB_0073dd8d:
            local_368._0_8_ = &local_358;
            local_420[0] = 0x21;
            local_420[1] = 0;
            local_368._0_8_ = std::__cxx11::string::_M_create((ulong *)local_368,(ulong)local_420);
            local_358.m_data[0] = local_420[0];
            local_358.m_data[1] = local_420[1];
            *(undefined8 *)((Vector<unsigned_int,_2> *)(local_368._0_8_ + 0x10))->m_data =
                 0x495f4b56206e7275;
            *(undefined8 *)((Vector<unsigned_int,_2> *)(local_368._0_8_ + 0x18))->m_data =
                 0x54454c504d4f434e;
            *(undefined8 *)((Vector<unsigned_int,_2> *)local_368._0_8_)->m_data = 0x6964207972657551
            ;
            *(undefined8 *)((Vector<unsigned_int,_2> *)(local_368._0_8_ + 8))->m_data =
                 0x7465722074276e64;
            *(undefined1 *)((Vector<unsigned_int,_2> *)(local_368._0_8_ + 0x20))->m_data = 0x45;
            local_368._8_4_ = local_420[0];
            local_368._12_4_ = local_420[1];
            *(VkInstance_s *)
             ((long)((Vector<unsigned_int,_2> *)local_368._0_8_)->m_data + (long)local_420) =
                 (VkInstance_s)0x0;
            tcu::ResultCollector::fail(&local_3b8,(string *)local_368);
            if ((Vector<unsigned_int,_2> *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,(ulong)((long)local_358.m_data + 1));
            }
          }
          if ((VkSurfaceFormatKHR *)local_498._0_8_ != (VkSurfaceFormatKHR *)0x0) {
            operator_delete((void *)local_498._0_8_,
                            local_488._M_allocated_capacity - local_498._0_8_);
          }
        }
        log = local_3e8;
        wsiType = local_474;
        if (local_438.
            super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
            _M_impl.super__Vector_impl_data._M_start != (VkSurfaceFormatKHR *)0x0) {
          operator_delete(local_438.
                          super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_438.
                                super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_438.
                                super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          wsiType = local_474;
        }
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 < (undefined1 *)
                       ((long)local_450.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_450.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  qVar6 = tcu::ResultCollector::getResult(&local_3b8);
  local_368._0_8_ = &local_358;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_368,local_3b8.m_message._M_dataplus._M_p,
             local_3b8.m_message._M_dataplus._M_p + local_3b8.m_message._M_string_length);
  pTVar3 = local_3f0;
  local_3f0->m_code = qVar6;
  (local_3f0->m_description)._M_dataplus._M_p = (pointer)&(local_3f0->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f0->m_description,local_368._0_8_,local_368._8_8_ + local_368._0_8_);
  if ((Vector<unsigned_int,_2> *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)((long)local_358.m_data + 1));
  }
  if (local_450.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_450.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_450.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_418 != (Vector<unsigned_int,_2> *)0x0) {
    (**(code **)(*(long *)aStack_410 + 0x68))(aStack_410.m_align,local_408,local_418,pVStack_400);
  }
  if (local_3d8.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
      m_data.ptr != (Window *)0x0) {
    (*(local_3d8.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
       m_data.ptr)->_vptr_Window[1])();
  }
  if (local_3d8.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
      m_data.ptr != (Display *)0x0) {
    (*(local_3d8.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
       m_data.ptr)->_vptr_Display[1])();
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
  if ((VkInstance)local_1e8._24_8_ != (VkInstance)0x0) {
    (*p_Stack_1c8)((VkInstance)local_1e8._24_8_,local_1c0);
  }
  local_1e8._24_8_ = 0;
  p_Stack_1c8 = (DestroyInstanceFunc)0x0;
  local_1c0 = (VkAllocationCallbacks *)0x0;
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
    operator_delete(local_3b8.m_message._M_dataplus._M_p,
                    local_3b8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_prefix._M_dataplus._M_p != &local_3b8.m_prefix.field_2) {
    operator_delete(local_3b8.m_prefix._M_dataplus._M_p,
                    local_3b8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus querySurfaceFormatsTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log				= context.getTestContext().getLog();
	tcu::ResultCollector			results			(log);

	const InstanceHelper			instHelper		(context, wsiType);
	const NativeObjects				native			(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>		surface			(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const vector<VkPhysicalDevice>	physicalDevices	= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);

	for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
	{
		if (isSupportedByAnyQueue(instHelper.vki, physicalDevices[deviceNdx], *surface))
		{
			const vector<VkSurfaceFormatKHR>	formats	= getPhysicalDeviceSurfaceFormats(instHelper.vki,
																						  physicalDevices[deviceNdx],
																						  *surface);

			log << TestLog::Message << "Device " << deviceNdx << ": " << tcu::formatArray(formats.begin(), formats.end()) << TestLog::EndMessage;

			validateSurfaceFormats(results, wsiType, formats);
			CheckPhysicalDeviceSurfaceFormatsIncompleteResult()(results, instHelper.vki, physicalDevices[deviceNdx], *surface, formats.size());
		}
		// else skip query as surface is not supported by the device
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}